

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location_impl.hpp
# Opt level: O2

location * toml::detail::make_temporary_location(location *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  container_type cont;
  allocator_type local_59;
  undefined1 local_58 [40];
  string local_30;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(local_58 + 0x10),
             str->_M_string_length,&local_59);
  pcVar1 = (str->_M_dataplus)._M_p;
  sVar2 = str->_M_string_length;
  for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
    *(char *)(local_58._16_8_ + sVar3) = pcVar1[sVar3];
  }
  std::
  make_shared<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"internal temporary",(allocator<char> *)&local_59);
  location::location(__return_storage_ptr__,(source_ptr *)local_58,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  CLI::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(local_58 + 0x10));
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE location make_temporary_location(const std::string& str) noexcept
{
    location::container_type cont(str.size());
    std::transform(str.begin(), str.end(), cont.begin(),
        [](const std::string::value_type& c) {
            return cxx::bit_cast<location::char_type>(c);
        });
    return location(std::make_shared<const location::container_type>(
            std::move(cont)), "internal temporary");
}